

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib517.c
# Opt level: O3

int test(char *URL)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = "Sun, 06 Nov 1994 08:49:37 GMT";
  lVar4 = 0x10;
  iVar2 = 0;
  do {
    lVar1 = curl_getdate(pcVar3,0);
    if (lVar1 != *(long *)((long)&__do_global_dtors_aux_fini_array_entry + lVar4)) {
      curl_mprintf("WRONGLY %s => %ld (instead of %ld)\n",pcVar3,lVar1);
      iVar2 = iVar2 + 1;
    }
    pcVar3 = *(char **)((long)&dates[0].input + lVar4);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x650);
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int i;
  int error = 0;

  (void)URL; /* not used */

  for(i = 0; dates[i].input; i++) {
    time_t out = curl_getdate(dates[i].input, NULL);
    if(out != dates[i].output) {
      printf("WRONGLY %s => %ld (instead of %ld)\n",
             dates[i].input, out, dates[i].output);
      error++;
    }
  }

  return error;
}